

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConvolutionLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  RepeatedField<unsigned_long> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  string *layerName;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  WeightParamType WVar7;
  WeightParamType WVar8;
  LayerUnion LVar9;
  undefined8 *puVar10;
  unsigned_long *puVar11;
  uint64 uVar12;
  long *plVar13;
  size_type *psVar14;
  unsigned_long uVar15;
  undefined8 uVar16;
  _Alloc_hider _Var17;
  WeightParams *pWVar18;
  unsigned_long __val;
  string err_1;
  Result r;
  string err;
  string local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b0;
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined1 local_288 [8];
  _Alloc_hider local_280;
  undefined1 local_278 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  uint64 local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  unsigned_long local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  void *local_148;
  uint64 local_140;
  ulong local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Result::Result((Result *)&local_2b0);
  validateInputCount((Result *)local_288,layer,1,2);
  local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288;
  std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_280);
  pcVar2 = local_278 + 8;
  if (local_280._M_p != pcVar2) {
    operator_delete(local_280._M_p,local_278._8_8_ + 1);
  }
  bVar5 = Result::good((Result *)&local_2b0);
  if (bVar5) {
    validateOutputCount((Result *)local_288,layer,1,1);
    local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288;
    std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_280);
    if (local_280._M_p != pcVar2) {
      operator_delete(local_280._M_p,local_278._8_8_ + 1);
    }
    bVar5 = Result::good((Result *)&local_2b0);
    if (bVar5) {
      if (this->ndArrayInterpretation != true) {
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ != 1) {
          std::operator+(&local_2d0,"Convolution Layer \'",(layer->name_).ptr_);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_2d0);
          local_288 = (undefined1  [8])local_278;
          psVar14 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_278._0_8_ = *psVar14;
            local_278._8_8_ = plVar13[3];
          }
          else {
            local_278._0_8_ = *psVar14;
            local_288 = (undefined1  [8])*plVar13;
          }
          local_280._M_p = (pointer)plVar13[1];
          *plVar13 = (long)psVar14;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_288);
          goto LAB_00532cf1;
        }
LAB_005327fe:
        if (layer->_oneof_case_[0] == 100) {
          LVar9 = layer->layer_;
        }
        else {
          LVar9.convolution_ = Specification::ConvolutionLayerParams::default_instance();
        }
        if ((LVar9.convolution_)->_oneof_case_[0] == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_288,"Padding type for convolution layer \'",(layer->name_).ptr_);
          puVar10 = (undefined8 *)std::__cxx11::string::append(local_288);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          psVar14 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_2d0.field_2._M_allocated_capacity = *psVar14;
            local_2d0.field_2._8_8_ = puVar10[3];
          }
          else {
            local_2d0.field_2._M_allocated_capacity = *psVar14;
            local_2d0._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_2d0._M_string_length = puVar10[1];
          *puVar10 = psVar14;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          if (local_288 != (undefined1  [8])local_278) {
            operator_delete((void *)local_288,local_278._0_8_ + 1);
          }
          Result::Result((Result *)local_288,INVALID_MODEL_PARAMETERS,&local_2d0);
          goto LAB_00532b9b;
        }
        if (layer->_oneof_case_[0] == 100) {
          LVar9 = layer->layer_;
        }
        else {
          LVar9.convolution_ = Specification::ConvolutionLayerParams::default_instance();
        }
        bVar5 = (LVar9.convolution_)->isdeconvolution_;
        if ((bVar5 == true) && ((layer->input_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
          std::operator+(&local_2d0,"Deconvolution Layer \'",(layer->name_).ptr_);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
          local_288 = (undefined1  [8])local_278;
          psVar14 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_278._0_8_ = *psVar14;
            local_278._8_8_ = puVar10[3];
          }
          else {
            local_278._0_8_ = *psVar14;
            local_288 = (undefined1  [8])*puVar10;
          }
          local_280._M_p = (pointer)puVar10[1];
          *puVar10 = psVar14;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_288);
LAB_00532cf1:
          uVar16 = local_278._0_8_;
          _Var17._M_p = (pointer)local_288;
          if (local_288 == (undefined1  [8])local_278) goto LAB_00532b1c;
        }
        else {
          if (((layer->input_).super_RepeatedPtrFieldBase.current_size_ != 1) &&
             (((this_00 = &(LVar9.convolution_)->dilationfactor_,
               0 < ((LVar9.convolution_)->dilationfactor_).current_size_ &&
               (puVar11 = google::protobuf::RepeatedField<unsigned_long>::Get(this_00,0),
               1 < *puVar11)) ||
              ((1 < this_00->current_size_ &&
               (puVar11 = google::protobuf::RepeatedField<unsigned_long>::Get(this_00,1),
               1 < *puVar11)))))) {
            std::operator+(&local_2d0,"Convolution layer: \'",(layer->name_).ptr_);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
            local_288 = (undefined1  [8])local_278;
            psVar14 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_278._0_8_ = *psVar14;
              local_278._8_8_ = puVar10[3];
            }
            else {
              local_278._0_8_ = *psVar14;
              local_288 = (undefined1  [8])*puVar10;
            }
            local_280._M_p = (pointer)puVar10[1];
            *puVar10 = psVar14;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_288);
            goto LAB_00532cf1;
          }
          local_1d0 = (string *)CONCAT71(local_1d0._1_7_,bVar5);
          local_138 = (LVar9.convolution_)->ngroups_ + (ulong)((LVar9.convolution_)->ngroups_ == 0);
          local_148 = (void *)0x3;
          local_218 = 3;
          if (0 < ((LVar9.convolution_)->kernelsize_).current_size_) {
            local_148 = ((LVar9.innerproduct_)->bias_->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                        .ptr_;
          }
          local_240 = (LVar9.convolution_)->outputchannels_;
          local_140 = (LVar9.convolution_)->kernelchannels_;
          if (1 < ((LVar9.convolution_)->kernelsize_).current_size_) {
            puVar11 = google::protobuf::RepeatedField<unsigned_long>::Get
                                (&(LVar9.convolution_)->kernelsize_,1);
            local_218 = *puVar11;
          }
          iVar3 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
          if (1 < iVar3) goto LAB_00532ace;
          bVar5 = (LVar9.convolution_)->hasbias_;
          if ((iVar3 != 1) && (bVar5 != false)) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_288,"Convolution layer: \'",(layer->name_).ptr_);
            puVar10 = (undefined8 *)std::__cxx11::string::append(local_288);
            psVar14 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_2d0.field_2._M_allocated_capacity = *psVar14;
              local_2d0.field_2._8_8_ = puVar10[3];
              local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            }
            else {
              local_2d0.field_2._M_allocated_capacity = *psVar14;
              local_2d0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_2d0._M_string_length = puVar10[1];
            *puVar10 = psVar14;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            if (local_288 != (undefined1  [8])local_278) {
              operator_delete((void *)local_288,local_278._0_8_ + 1);
            }
            Result::Result((Result *)local_288,INVALID_MODEL_PARAMETERS,&local_2d0);
            local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_288;
            std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_280);
            if (local_280._M_p != pcVar2) {
              operator_delete(local_280._M_p,local_278._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          pWVar18 = (LVar9.convolution_)->weights_;
          if (pWVar18 == (WeightParams *)0x0) {
            pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          WVar7 = valueType(pWVar18);
          pWVar18 = (LVar9.convolution_)->bias_;
          if (pWVar18 == (WeightParams *)0x0) {
            pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          WVar8 = valueType(pWVar18);
          if ((WVar7 != UNSPECIFIED) && ((WVar8 == UNSPECIFIED & bVar5) == 0)) {
            if ((bVar5 == false) ||
               (((WVar7 != FLOAT16 || (WVar8 != FLOAT32)) &&
                ((WVar7 != FLOAT32 || (WVar8 != FLOAT16)))))) {
              uVar12 = local_240;
              if ((char)local_1d0 != '\0') {
                uVar12 = local_240 / local_138;
              }
              uVar15 = local_218 * (long)local_148 * uVar12 * local_140;
              if (WVar7 < QUINT) {
                pWVar18 = (LVar9.convolution_)->weights_;
                if (pWVar18 == (WeightParams *)0x0) {
                  pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                if (WVar7 == FLOAT32) {
                  __val = (unsigned_long)(pWVar18->floatvalue_).current_size_;
                }
                else {
                  __val = ((pWVar18->float16value_).ptr_)->_M_string_length >> 1;
                }
                if (__val != uVar15) {
                  if ((char)local_1d0 == '\0') {
                    std::operator+(&local_90,"Convolution layer \'",(layer->name_).ptr_);
                    plVar13 = (long *)std::__cxx11::string::append((char *)&local_90);
                    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                    psVar14 = (size_type *)(plVar13 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar13 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_1f0.field_2._M_allocated_capacity = *psVar14;
                      local_1f0.field_2._8_8_ = plVar13[3];
                    }
                    else {
                      local_1f0.field_2._M_allocated_capacity = *psVar14;
                      local_1f0._M_dataplus._M_p = (pointer)*plVar13;
                    }
                    local_1f0._M_string_length = plVar13[1];
                    *plVar13 = (long)psVar14;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    std::__cxx11::to_string(&local_b0,__val);
                    std::operator+(&local_70,&local_1f0,&local_b0);
                    plVar13 = (long *)std::__cxx11::string::append((char *)&local_70);
                    psVar14 = (size_type *)(plVar13 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar13 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_1c8.field_2._M_allocated_capacity = *psVar14;
                      local_1c8.field_2._8_8_ = plVar13[3];
                      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                    }
                    else {
                      local_1c8.field_2._M_allocated_capacity = *psVar14;
                      local_1c8._M_dataplus._M_p = (pointer)*plVar13;
                    }
                    local_1c8._M_string_length = plVar13[1];
                    *plVar13 = (long)psVar14;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    std::__cxx11::to_string(&local_d0,local_240);
                    std::operator+(&local_1a8,&local_1c8,&local_d0);
                    pvVar4 = local_148;
                    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a8);
                    psVar14 = (size_type *)(plVar13 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar13 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_210.field_2._M_allocated_capacity = *psVar14;
                      local_210.field_2._8_8_ = plVar13[3];
                      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
                    }
                    else {
                      local_210.field_2._M_allocated_capacity = *psVar14;
                      local_210._M_dataplus._M_p = (pointer)*plVar13;
                    }
                    local_210._M_string_length = plVar13[1];
                    *plVar13 = (long)psVar14;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    std::__cxx11::to_string(&local_f0,local_140);
                    std::operator+(&local_188,&local_210,&local_f0);
                    plVar13 = (long *)std::__cxx11::string::append((char *)&local_188);
                    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                    psVar14 = (size_type *)(plVar13 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar13 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_238.field_2._M_allocated_capacity = *psVar14;
                      local_238.field_2._8_8_ = plVar13[3];
                    }
                    else {
                      local_238.field_2._M_allocated_capacity = *psVar14;
                      local_238._M_dataplus._M_p = (pointer)*plVar13;
                    }
                    local_238._M_string_length = plVar13[1];
                    *plVar13 = (long)psVar14;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    std::__cxx11::to_string(&local_110,(unsigned_long)pvVar4);
                    std::operator+(&local_168,&local_238,&local_110);
                    plVar13 = (long *)std::__cxx11::string::append((char *)&local_168);
                    psVar14 = (size_type *)(plVar13 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar13 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_260.field_2._M_allocated_capacity = *psVar14;
                      local_260.field_2._8_8_ = plVar13[3];
                      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                    }
                    else {
                      local_260.field_2._M_allocated_capacity = *psVar14;
                      local_260._M_dataplus._M_p = (pointer)*plVar13;
                    }
                    local_260._M_string_length = plVar13[1];
                    *plVar13 = (long)psVar14;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    std::__cxx11::to_string(&local_130,local_218);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_288,&local_260,&local_130);
                    puVar10 = (undefined8 *)std::__cxx11::string::append(local_288);
                    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    psVar14 = puVar10 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar10 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_2d0.field_2._M_allocated_capacity = *psVar14;
                      local_2d0.field_2._8_8_ = puVar10[3];
                    }
                    else {
                      local_2d0.field_2._M_allocated_capacity = *psVar14;
                      local_2d0._M_dataplus._M_p = (pointer)*puVar10;
                    }
                    local_2d0._M_string_length = puVar10[1];
                    *puVar10 = psVar14;
                    puVar10[1] = 0;
                    *(undefined1 *)(puVar10 + 2) = 0;
                    if (local_288 != (undefined1  [8])local_278) {
                      operator_delete((void *)local_288,local_278._0_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_130._M_dataplus._M_p != &local_130.field_2) {
                      operator_delete(local_130._M_dataplus._M_p,
                                      local_130.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_260._M_dataplus._M_p != &local_260.field_2) {
                      operator_delete(local_260._M_dataplus._M_p,
                                      local_260.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                      operator_delete(local_168._M_dataplus._M_p,
                                      local_168.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_110._M_dataplus._M_p != &local_110.field_2) {
                      operator_delete(local_110._M_dataplus._M_p,
                                      local_110.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_238._M_dataplus._M_p != &local_238.field_2) {
                      operator_delete(local_238._M_dataplus._M_p,
                                      local_238.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_188._M_dataplus._M_p != &local_188.field_2) {
                      operator_delete(local_188._M_dataplus._M_p,
                                      local_188.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                      operator_delete(local_f0._M_dataplus._M_p,
                                      local_f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_210._M_dataplus._M_p != &local_210.field_2) {
                      operator_delete(local_210._M_dataplus._M_p,
                                      local_210.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                      operator_delete(local_1a8._M_dataplus._M_p,
                                      local_1a8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                      operator_delete(local_d0._M_dataplus._M_p,
                                      local_d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                      operator_delete(local_1c8._M_dataplus._M_p,
                                      local_1c8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_70._M_dataplus._M_p != &local_70.field_2) {
                      operator_delete(local_70._M_dataplus._M_p,
                                      local_70.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p,
                                      local_b0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                      operator_delete(local_1f0._M_dataplus._M_p,
                                      local_1f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p != &local_90.field_2) {
                      operator_delete(local_90._M_dataplus._M_p,
                                      local_90.field_2._M_allocated_capacity + 1);
                    }
                    Result::Result((Result *)local_288,INVALID_MODEL_PARAMETERS,&local_2d0);
                  }
                  else {
                    std::operator+(&local_90,"Deconvolution layer \'",(layer->name_).ptr_);
                    plVar13 = (long *)std::__cxx11::string::append((char *)&local_90);
                    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                    psVar14 = (size_type *)(plVar13 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar13 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_1f0.field_2._M_allocated_capacity = *psVar14;
                      local_1f0.field_2._8_8_ = plVar13[3];
                    }
                    else {
                      local_1f0.field_2._M_allocated_capacity = *psVar14;
                      local_1f0._M_dataplus._M_p = (pointer)*plVar13;
                    }
                    local_1f0._M_string_length = plVar13[1];
                    *plVar13 = (long)psVar14;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    std::__cxx11::to_string(&local_b0,__val);
                    std::operator+(&local_70,&local_1f0,&local_b0);
                    plVar13 = (long *)std::__cxx11::string::append((char *)&local_70);
                    psVar14 = (size_type *)(plVar13 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar13 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_1c8.field_2._M_allocated_capacity = *psVar14;
                      local_1c8.field_2._8_8_ = plVar13[3];
                      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                    }
                    else {
                      local_1c8.field_2._M_allocated_capacity = *psVar14;
                      local_1c8._M_dataplus._M_p = (pointer)*plVar13;
                    }
                    local_1c8._M_string_length = plVar13[1];
                    *plVar13 = (long)psVar14;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    std::__cxx11::to_string(&local_d0,local_140);
                    std::operator+(&local_1a8,&local_1c8,&local_d0);
                    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a8);
                    psVar14 = (size_type *)(plVar13 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar13 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_210.field_2._M_allocated_capacity = *psVar14;
                      local_210.field_2._8_8_ = plVar13[3];
                      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
                    }
                    else {
                      local_210.field_2._M_allocated_capacity = *psVar14;
                      local_210._M_dataplus._M_p = (pointer)*plVar13;
                    }
                    local_210._M_string_length = plVar13[1];
                    *plVar13 = (long)psVar14;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    std::__cxx11::to_string(&local_f0,local_240 / local_138);
                    std::operator+(&local_188,&local_210,&local_f0);
                    pvVar4 = local_148;
                    plVar13 = (long *)std::__cxx11::string::append((char *)&local_188);
                    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                    psVar14 = (size_type *)(plVar13 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar13 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_238.field_2._M_allocated_capacity = *psVar14;
                      local_238.field_2._8_8_ = plVar13[3];
                    }
                    else {
                      local_238.field_2._M_allocated_capacity = *psVar14;
                      local_238._M_dataplus._M_p = (pointer)*plVar13;
                    }
                    local_238._M_string_length = plVar13[1];
                    *plVar13 = (long)psVar14;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    std::__cxx11::to_string(&local_110,(unsigned_long)pvVar4);
                    std::operator+(&local_168,&local_238,&local_110);
                    plVar13 = (long *)std::__cxx11::string::append((char *)&local_168);
                    psVar14 = (size_type *)(plVar13 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar13 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_260.field_2._M_allocated_capacity = *psVar14;
                      local_260.field_2._8_8_ = plVar13[3];
                      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                    }
                    else {
                      local_260.field_2._M_allocated_capacity = *psVar14;
                      local_260._M_dataplus._M_p = (pointer)*plVar13;
                    }
                    local_260._M_string_length = plVar13[1];
                    *plVar13 = (long)psVar14;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    std::__cxx11::to_string(&local_130,local_218);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_288,&local_260,&local_130);
                    puVar10 = (undefined8 *)std::__cxx11::string::append(local_288);
                    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    psVar14 = puVar10 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar10 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_2d0.field_2._M_allocated_capacity = *psVar14;
                      local_2d0.field_2._8_8_ = puVar10[3];
                    }
                    else {
                      local_2d0.field_2._M_allocated_capacity = *psVar14;
                      local_2d0._M_dataplus._M_p = (pointer)*puVar10;
                    }
                    local_2d0._M_string_length = puVar10[1];
                    *puVar10 = psVar14;
                    puVar10[1] = 0;
                    *(undefined1 *)(puVar10 + 2) = 0;
                    if (local_288 != (undefined1  [8])local_278) {
                      operator_delete((void *)local_288,local_278._0_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_130._M_dataplus._M_p != &local_130.field_2) {
                      operator_delete(local_130._M_dataplus._M_p,
                                      local_130.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_260._M_dataplus._M_p != &local_260.field_2) {
                      operator_delete(local_260._M_dataplus._M_p,
                                      local_260.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                      operator_delete(local_168._M_dataplus._M_p,
                                      local_168.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_110._M_dataplus._M_p != &local_110.field_2) {
                      operator_delete(local_110._M_dataplus._M_p,
                                      local_110.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_238._M_dataplus._M_p != &local_238.field_2) {
                      operator_delete(local_238._M_dataplus._M_p,
                                      local_238.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_188._M_dataplus._M_p != &local_188.field_2) {
                      operator_delete(local_188._M_dataplus._M_p,
                                      local_188.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                      operator_delete(local_f0._M_dataplus._M_p,
                                      local_f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_210._M_dataplus._M_p != &local_210.field_2) {
                      operator_delete(local_210._M_dataplus._M_p,
                                      local_210.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                      operator_delete(local_1a8._M_dataplus._M_p,
                                      local_1a8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                      operator_delete(local_d0._M_dataplus._M_p,
                                      local_d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                      operator_delete(local_1c8._M_dataplus._M_p,
                                      local_1c8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_70._M_dataplus._M_p != &local_70.field_2) {
                      operator_delete(local_70._M_dataplus._M_p,
                                      local_70.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p,
                                      local_b0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                      operator_delete(local_1f0._M_dataplus._M_p,
                                      local_1f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p != &local_90.field_2) {
                      operator_delete(local_90._M_dataplus._M_p,
                                      local_90.field_2._M_allocated_capacity + 1);
                    }
                    Result::Result((Result *)local_288,INVALID_MODEL_PARAMETERS,&local_2d0);
                  }
                  goto LAB_00532b9b;
                }
              }
              else {
                if (WVar7 != QUINT) {
                  std::operator+(&local_260,"Layer ",(layer->name_).ptr_);
                  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
                  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                  psVar14 = puVar10 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar14) {
                    local_2d0.field_2._M_allocated_capacity = *psVar14;
                    local_2d0.field_2._8_8_ = puVar10[3];
                  }
                  else {
                    local_2d0.field_2._M_allocated_capacity = *psVar14;
                    local_2d0._M_dataplus._M_p = (pointer)*puVar10;
                  }
                  local_2d0._M_string_length = puVar10[1];
                  *puVar10 = psVar14;
                  puVar10[1] = 0;
                  *(undefined1 *)(puVar10 + 2) = 0;
                  Result::Result((Result *)local_288,INVALID_MODEL_PARAMETERS,&local_2d0);
                  goto LAB_00533401;
                }
                pWVar18 = (LVar9.convolution_)->weights_;
                if (pWVar18 == (WeightParams *)0x0) {
                  pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                local_218 = uVar15;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_2d0,"Convolution","");
                local_1d0 = (layer->name_).ptr_;
                local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"weight","");
                validateGeneralWeightParams
                          ((Result *)local_288,pWVar18,local_218,local_240,&local_2d0,local_1d0,
                           &local_260);
                local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_288;
                std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_280);
                if (local_280._M_p != pcVar2) {
                  operator_delete(local_280._M_p,local_278._8_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_260._M_dataplus._M_p != &local_260.field_2) {
                  operator_delete(local_260._M_dataplus._M_p,
                                  local_260.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                  operator_delete(local_2d0._M_dataplus._M_p,
                                  local_2d0.field_2._M_allocated_capacity + 1);
                }
                bVar6 = Result::good((Result *)&local_2b0);
                if (!bVar6) goto LAB_00532ace;
              }
              if (bVar5 != false) {
                if (WVar8 < QUINT) {
                  pWVar18 = (LVar9.convolution_)->bias_;
                  if (pWVar18 == (WeightParams *)0x0) {
                    pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  if (WVar8 == FLOAT32) {
                    uVar15 = (unsigned_long)(pWVar18->floatvalue_).current_size_;
                  }
                  else {
                    uVar15 = ((pWVar18->float16value_).ptr_)->_M_string_length >> 1;
                  }
                  if (uVar15 != local_240) {
                    std::operator+(&local_188,"Convolution layer \'",(layer->name_).ptr_);
                    plVar13 = (long *)std::__cxx11::string::append((char *)&local_188);
                    psVar14 = (size_type *)(plVar13 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar13 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_238.field_2._M_allocated_capacity = *psVar14;
                      local_238.field_2._8_8_ = plVar13[3];
                      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                    }
                    else {
                      local_238.field_2._M_allocated_capacity = *psVar14;
                      local_238._M_dataplus._M_p = (pointer)*plVar13;
                    }
                    local_238._M_string_length = plVar13[1];
                    *plVar13 = (long)psVar14;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    std::__cxx11::to_string(&local_210,uVar15);
                    std::operator+(&local_168,&local_238,&local_210);
                    plVar13 = (long *)std::__cxx11::string::append((char *)&local_168);
                    psVar14 = (size_type *)(plVar13 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar13 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_260.field_2._M_allocated_capacity = *psVar14;
                      local_260.field_2._8_8_ = plVar13[3];
                      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                    }
                    else {
                      local_260.field_2._M_allocated_capacity = *psVar14;
                      local_260._M_dataplus._M_p = (pointer)*plVar13;
                    }
                    local_260._M_string_length = plVar13[1];
                    *plVar13 = (long)psVar14;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    std::__cxx11::to_string(&local_1a8,local_240);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_288,&local_260,&local_1a8);
                    puVar10 = (undefined8 *)std::__cxx11::string::append(local_288);
                    psVar14 = puVar10 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar10 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_2d0.field_2._M_allocated_capacity = *psVar14;
                      local_2d0.field_2._8_8_ = puVar10[3];
                      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    }
                    else {
                      local_2d0.field_2._M_allocated_capacity = *psVar14;
                      local_2d0._M_dataplus._M_p = (pointer)*puVar10;
                    }
                    local_2d0._M_string_length = puVar10[1];
                    *puVar10 = psVar14;
                    puVar10[1] = 0;
                    *(undefined1 *)(puVar10 + 2) = 0;
                    if (local_288 != (undefined1  [8])local_278) {
                      operator_delete((void *)local_288,local_278._0_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                      operator_delete(local_1a8._M_dataplus._M_p,
                                      local_1a8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_260._M_dataplus._M_p != &local_260.field_2) {
                      operator_delete(local_260._M_dataplus._M_p,
                                      local_260.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                      operator_delete(local_168._M_dataplus._M_p,
                                      local_168.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_210._M_dataplus._M_p != &local_210.field_2) {
                      operator_delete(local_210._M_dataplus._M_p,
                                      local_210.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_238._M_dataplus._M_p != &local_238.field_2) {
                      operator_delete(local_238._M_dataplus._M_p,
                                      local_238.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_188._M_dataplus._M_p != &local_188.field_2) {
                      operator_delete(local_188._M_dataplus._M_p,
                                      local_188.field_2._M_allocated_capacity + 1);
                    }
                    Result::Result((Result *)local_288,INVALID_MODEL_PARAMETERS,&local_2d0);
                    local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_288;
                    std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_280);
                    if (local_280._M_p != pcVar2) {
                      operator_delete(local_280._M_p,local_278._8_8_ + 1);
                    }
                    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)__return_storage_ptr__ = local_2b0;
                    paVar1 = &(__return_storage_ptr__->m_message).field_2;
                    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2a8._M_p == &local_298) {
                      paVar1->_M_allocated_capacity =
                           CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0])
                      ;
                      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
                           local_298._8_8_;
                    }
                    else {
                      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_2a8._M_p;
                      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
                           CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0])
                      ;
                    }
                    (__return_storage_ptr__->m_message)._M_string_length = local_2a0;
                    local_2a0 = 0;
                    local_298._M_local_buf[0] = '\0';
                    local_2a8._M_p = (pointer)&local_298;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p == &local_2d0.field_2) goto LAB_00532b1c;
                    goto LAB_00532c27;
                  }
                }
                else {
                  if (WVar8 != QUINT) {
                    std::operator+(&local_260,"Layer ",(layer->name_).ptr_);
                    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
                    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    psVar14 = puVar10 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar10 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar14) {
                      local_2d0.field_2._M_allocated_capacity = *psVar14;
                      local_2d0.field_2._8_8_ = puVar10[3];
                    }
                    else {
                      local_2d0.field_2._M_allocated_capacity = *psVar14;
                      local_2d0._M_dataplus._M_p = (pointer)*puVar10;
                    }
                    local_2d0._M_string_length = puVar10[1];
                    *puVar10 = psVar14;
                    puVar10[1] = 0;
                    *(undefined1 *)(puVar10 + 2) = 0;
                    Result::Result((Result *)local_288,INVALID_MODEL_PARAMETERS,&local_2d0);
                    goto LAB_00533401;
                  }
                  pWVar18 = (LVar9.convolution_)->bias_;
                  if (pWVar18 == (WeightParams *)0x0) {
                    pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2d0,"Convolution","");
                  layerName = (layer->name_).ptr_;
                  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"bias","");
                  validateGeneralWeightParams
                            ((Result *)local_288,pWVar18,local_240,1,&local_2d0,layerName,&local_260
                            );
                  local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_288;
                  std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_280);
                  if (local_280._M_p != pcVar2) {
                    operator_delete(local_280._M_p,local_278._8_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_260._M_dataplus._M_p != &local_260.field_2) {
                    operator_delete(local_260._M_dataplus._M_p,
                                    local_260.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                    operator_delete(local_2d0._M_dataplus._M_p,
                                    local_2d0.field_2._M_allocated_capacity + 1);
                  }
                  Result::good((Result *)&local_2b0);
                }
              }
            }
            else {
              std::operator+(&local_260,"Convolution layer ",(layer->name_).ptr_);
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
              local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
              psVar14 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_2d0.field_2._M_allocated_capacity = *psVar14;
                local_2d0.field_2._8_8_ = puVar10[3];
              }
              else {
                local_2d0.field_2._M_allocated_capacity = *psVar14;
                local_2d0._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_2d0._M_string_length = puVar10[1];
              *puVar10 = psVar14;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              Result::Result((Result *)local_288,INVALID_MODEL_PARAMETERS,&local_2d0);
LAB_00533401:
              local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_288;
              std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_280);
              if (local_280._M_p != pcVar2) {
                operator_delete(local_280._M_p,local_278._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                local_260.field_2._M_allocated_capacity + 1);
              }
            }
            goto LAB_00532ace;
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_288,"Convolution layer \'",(layer->name_).ptr_);
          puVar10 = (undefined8 *)std::__cxx11::string::append(local_288);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          psVar14 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_2d0.field_2._M_allocated_capacity = *psVar14;
            local_2d0.field_2._8_8_ = puVar10[3];
          }
          else {
            local_2d0.field_2._M_allocated_capacity = *psVar14;
            local_2d0._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_2d0._M_string_length = puVar10[1];
          *puVar10 = psVar14;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          if (local_288 != (undefined1  [8])local_278) {
            operator_delete((void *)local_288,local_278._0_8_ + 1);
          }
          Result::Result((Result *)local_288,INVALID_MODEL_PARAMETERS,&local_2d0);
LAB_00532b9b:
          local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_288;
          std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_280);
          if (local_280._M_p != pcVar2) {
            operator_delete(local_280._M_p,local_278._8_8_ + 1);
          }
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)__return_storage_ptr__ = local_2b0;
          paVar1 = &(__return_storage_ptr__->m_message).field_2;
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_p == &local_298) {
            paVar1->_M_allocated_capacity =
                 CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0]);
            *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
                 local_298._8_8_;
          }
          else {
            (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_2a8._M_p;
            (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
                 CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0]);
          }
          (__return_storage_ptr__->m_message)._M_string_length = local_2a0;
          local_2a0 = 0;
          local_298._M_local_buf[0] = '\0';
          local_2a8._M_p = (pointer)&local_298;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p == &local_2d0.field_2) goto LAB_00532b1c;
LAB_00532c27:
          local_2a8._M_p = (pointer)&local_298;
          local_298._M_local_buf[0] = '\0';
          local_2a0 = 0;
          uVar16 = local_2d0.field_2._M_allocated_capacity;
          _Var17._M_p = local_2d0._M_dataplus._M_p;
        }
        operator_delete(_Var17._M_p,uVar16 + 1);
        goto LAB_00532b1c;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Convolution","");
      validateInputOutputRankEquality((Result *)local_288,layer,&local_50,&this->blobNameToRank);
      local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_288;
      std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_280);
      if (local_280._M_p != pcVar2) {
        operator_delete(local_280._M_p,local_278._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar5 = Result::good((Result *)&local_2b0);
      if (bVar5) {
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Convolution","");
        validateRankCount((Result *)local_288,layer,&local_2d0,4,-1,&this->blobNameToRank);
        local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_288;
        std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_280);
        if (local_280._M_p != pcVar2) {
          operator_delete(local_280._M_p,local_278._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        bVar5 = Result::good((Result *)&local_2b0);
        if (bVar5) goto LAB_005327fe;
      }
    }
  }
LAB_00532ace:
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_2b0;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_p == &local_298) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_298._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_2a8._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_2a0;
  local_2a0 = 0;
  local_298._M_local_buf[0] = '\0';
  local_2a8._M_p = (pointer)&local_298;
LAB_00532b1c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_p != &local_298) {
    operator_delete(local_2a8._M_p,
                    CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConvolutionLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 2);
    if (!r.good()) {return r;}

    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) {return r;}

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Convolution", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Convolution", 4, -1, blobNameToRank);
        if (!r.good()) {return r;}
    } else {
        if (layer.input_size() != 1) {
            std::string err = "Convolution Layer '" + layer.name() +
            "' does not support weight as input tensor when RANK5_ARRAY_MAPPING == true.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    // We need to check if the ConvolutionPaddingType is set
    if (layer.convolution().ConvolutionPaddingType_case() == Specification::ConvolutionLayerParams::ConvolutionPaddingTypeCase::CONVOLUTIONPADDINGTYPE_NOT_SET) {
        std::string err = "Padding type for convolution layer '" + layer.name() + "' is not set.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    const auto& params = layer.convolution();
    bool is_deconv = params.isdeconvolution();
    if (is_deconv && layer.input_size() != 1) {
        std::string err = "Deconvolution Layer '" + layer.name() + "' does not support weight as input tensor.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.input_size() != 1 && (
        ((params.dilationfactor_size() > 0 && params.dilationfactor(0) > 1) ||
        (params.dilationfactor_size() > 1 && params.dilationfactor(1) > 1))
        )) {
        std::string err = "Convolution layer: '" + layer.name() + "' , dilated convolution does not support weight as input tensor.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    uint64_t kernelChannels = params.kernelchannels();
    uint64_t outputChannels = params.outputchannels();
    uint64_t nGroups = params.ngroups();
    if (nGroups == 0) {
        // default value specified in protobuf
        nGroups = 1;
    }
    uint64_t kernelHeight;
    if (params.kernelsize_size() > 0) {
        kernelHeight = params.kernelsize(0);
    }
    else {
        // this is the default specified in the protobuf file
        kernelHeight = 3;
    }
    uint64_t kernelWidth;
    if (params.kernelsize_size() > 1) {
        kernelWidth = params.kernelsize(1);
    }
    else {
        kernelWidth = 3;
    }

    if (layer.input_size() > 1) {
        return r;
    }

    bool has_bias = params.hasbias();
    if (has_bias && layer.input_size() != 1) {
        std::string err = "Convolution layer: '" + layer.name() + "' with dynamic weight does not support static bias.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(params.weights());
    biasValueType = valueType(params.bias());

    // Check weight/bias value types. Only float32 or float16 parameters can be populated at any time
    if ( (weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        std::string err = "Convolution layer '" + layer.name() + "'  has invalid weights/bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Convolution layer " + layer.name() +
                       "has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }

    // Get populated weight and bias sizes
    // Check weights
    uint64_t expected_weight_size = 0;
    // conv: outputChannels, kernelChannels, kernelHeight, kernelWidth
    // deconv: kernelChannels, outputChannels / nGroups, kernelHeight, kernelWidth
    if (is_deconv) {
        expected_weight_size = kernelChannels * (outputChannels / nGroups) * kernelHeight * kernelWidth;
    }
    else {
        expected_weight_size = outputChannels * kernelChannels * kernelHeight * kernelWidth;
    }
    uint64_t weight_size = 0;
    if (weightsValueType == FLOAT32 || weightsValueType == FLOAT16) {
        if (weightsValueType == FLOAT32) {
            weight_size = static_cast<uint64_t>(params.weights().floatvalue().size());
        } else {
            weight_size = static_cast<uint64_t>(params.weights().float16value().size() / 2);
        }
        if (weight_size != expected_weight_size) {
            if (is_deconv) {
                std::string err = "Deconvolution layer '" + layer.name() + "' has weight matrix of size " + std::to_string(weight_size) + " to encode a " + std::to_string(kernelChannels) + " × " + std::to_string(outputChannels/nGroups) + " × " + std::to_string(kernelHeight) + " × " + std::to_string(kernelWidth) + " convolution.";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
            else {
                std::string err = "Convolution layer '" + layer.name() + "' has weight matrix of size " + std::to_string(weight_size) + " to encode a " + std::to_string(outputChannels) + " × " + std::to_string(kernelChannels) + " × " + std::to_string(kernelHeight) + " × " + std::to_string(kernelWidth) + " convolution.";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        }
    } // if (weightsValueType == FLOAT32 || weightsValueType == FLOAT16)
    else if (weightsValueType == QUINT) {
        r = validateGeneralWeightParams(params.weights(), expected_weight_size, outputChannels, "Convolution", layer.name(), "weight");
        if (!r.good()) return r;
    } else { // EMPTY
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer " + layer.name() + "has not specified weights.");
        return r;
    }

    // Check the bias
    uint64_t bias_size = 0;
    if (has_bias) {
        if (biasValueType == FLOAT32 || biasValueType == FLOAT16){
            if (biasValueType == FLOAT32){
                bias_size = static_cast<uint64_t>(params.bias().floatvalue().size());
            } else {
                bias_size = static_cast<uint64_t>(params.bias().float16value().size() / 2);
            }
            if (bias_size != outputChannels) {
                std::string err = "Convolution layer '" + layer.name() + "' has a bias vector of size " +
                std::to_string(bias_size) + " but should be " + std::to_string(outputChannels) + ".";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        } else if (biasValueType == QUINT){
            // quantization of bias vector should be 1
            r = validateGeneralWeightParams(params.bias(), outputChannels, 1, "Convolution", layer.name(), "bias");
            if (!r.good()) return r;
        } else { // EMPTY
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer " + layer.name() + "has not specified bias.");
            return r;
        }
    }
    return r;
}